

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O1

void __thiscall Fl_RGB_Image::color_average(Fl_RGB_Image *this,Fl_Color c,float i)

{
  byte *pbVar1;
  int iVar2;
  uchar *puVar3;
  uchar *puVar4;
  byte *pbVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  float fVar10;
  uchar b;
  uchar g;
  uchar r;
  byte local_1f;
  byte local_1e;
  byte local_1d;
  float local_1c;
  
  if (((((this->super_Fl_Image).w_ != 0) && ((this->super_Fl_Image).h_ != 0)) &&
      ((this->super_Fl_Image).d_ != 0)) && (this->array != (uchar *)0x0)) {
    local_1c = i;
    (*(this->super_Fl_Image)._vptr_Fl_Image[8])(this);
    if (this->alloc_array == 0) {
      puVar3 = (uchar *)operator_new__((long)(this->super_Fl_Image).d_ *
                                       (long)(this->super_Fl_Image).w_ *
                                       (long)(this->super_Fl_Image).h_);
    }
    else {
      puVar3 = this->array;
    }
    Fl::get_color(c,&local_1d,&local_1e,&local_1f);
    fVar10 = 0.0;
    if ((0.0 <= local_1c) && (fVar10 = local_1c, 1.0 < local_1c)) {
      fVar10 = 1.0;
    }
    iVar2 = (this->super_Fl_Image).ld_;
    if (iVar2 == 0) {
      lVar9 = 0;
    }
    else {
      lVar9 = (long)(iVar2 - (this->super_Fl_Image).d_ * (this->super_Fl_Image).w_);
    }
    iVar2 = (int)(long)(fVar10 * 256.0);
    iVar7 = 0x100 - iVar2;
    if ((this->super_Fl_Image).d_ < 3) {
      if (0 < (this->super_Fl_Image).h_) {
        pbVar5 = this->array;
        iVar6 = 0;
        puVar4 = puVar3;
        do {
          if (0 < (this->super_Fl_Image).w_) {
            iVar8 = 0;
            do {
              *puVar4 = (uchar)((uint)*pbVar5 * iVar2 +
                                (((uint)local_1e * 0x3d + (uint)local_1d * 0x1f + (uint)local_1f * 8
                                 ) / 100) * iVar7 >> 8);
              if ((this->super_Fl_Image).d_ < 2) {
                pbVar5 = pbVar5 + 1;
                puVar4 = puVar4 + 1;
              }
              else {
                pbVar1 = pbVar5 + 1;
                pbVar5 = pbVar5 + 2;
                puVar4[1] = *pbVar1;
                puVar4 = puVar4 + 2;
              }
              iVar8 = iVar8 + 1;
            } while (iVar8 < (this->super_Fl_Image).w_);
          }
          iVar6 = iVar6 + 1;
          pbVar5 = pbVar5 + lVar9;
        } while (iVar6 < (this->super_Fl_Image).h_);
      }
    }
    else if (0 < (this->super_Fl_Image).h_) {
      pbVar5 = this->array;
      iVar6 = 0;
      puVar4 = puVar3;
      do {
        if (0 < (this->super_Fl_Image).w_) {
          iVar8 = 0;
          do {
            *puVar4 = (uchar)((uint)*pbVar5 * iVar2 + (uint)local_1d * iVar7 >> 8);
            puVar4[1] = (uchar)((uint)pbVar5[1] * iVar2 + (uint)local_1e * iVar7 >> 8);
            puVar4[2] = (uchar)((uint)pbVar5[2] * iVar2 + (uint)local_1f * iVar7 >> 8);
            if ((this->super_Fl_Image).d_ < 4) {
              pbVar5 = pbVar5 + 3;
              puVar4 = puVar4 + 3;
            }
            else {
              pbVar1 = pbVar5 + 3;
              pbVar5 = pbVar5 + 4;
              puVar4[3] = *pbVar1;
              puVar4 = puVar4 + 4;
            }
            iVar8 = iVar8 + 1;
          } while (iVar8 < (this->super_Fl_Image).w_);
        }
        iVar6 = iVar6 + 1;
        pbVar5 = pbVar5 + lVar9;
      } while (iVar6 < (this->super_Fl_Image).h_);
    }
    if (this->alloc_array == 0) {
      this->array = puVar3;
      this->alloc_array = 1;
      (this->super_Fl_Image).ld_ = 0;
    }
  }
  return;
}

Assistant:

void Fl_RGB_Image::color_average(Fl_Color c, float i) {
  // Don't average an empty image...
  if (!w() || !h() || !d() || !array) return;

  // Delete any existing pixmap/mask objects...
  uncache();

  // Allocate memory as needed...
  uchar		*new_array,
		*new_ptr;

  if (!alloc_array) new_array = new uchar[h() * w() * d()];
  else new_array = (uchar *)array;

  // Get the color to blend with...
  uchar		r, g, b;
  unsigned	ia, ir, ig, ib;

  Fl::get_color(c, r, g, b);
  if (i < 0.0f) i = 0.0f;
  else if (i > 1.0f) i = 1.0f;

  ia = (unsigned)(256 * i);
  ir = r * (256 - ia);
  ig = g * (256 - ia);
  ib = b * (256 - ia);

  // Update the image data to do the blend...
  const uchar	*old_ptr;
  int		x, y;
  int   line_i = ld() ? ld() - (w()*d()) : 0; // increment from line end to beginning of next line

  if (d() < 3) {
    ig = (r * 31 + g * 61 + b * 8) / 100 * (256 - ia);

    for (new_ptr = new_array, old_ptr = array, y = 0; y < h(); y ++, old_ptr += line_i)
      for (x = 0; x < w(); x ++) {
	*new_ptr++ = (*old_ptr++ * ia + ig) >> 8;
	if (d() > 1) *new_ptr++ = *old_ptr++;
      }
  } else {
    for (new_ptr = new_array, old_ptr = array, y = 0; y < h(); y ++, old_ptr += line_i)
      for (x = 0; x < w(); x ++) {
	*new_ptr++ = (*old_ptr++ * ia + ir) >> 8;
	*new_ptr++ = (*old_ptr++ * ia + ig) >> 8;
	*new_ptr++ = (*old_ptr++ * ia + ib) >> 8;
	if (d() > 3) *new_ptr++ = *old_ptr++;
      }
  }

  // Set the new pointers/values as needed...
  if (!alloc_array) {
    array       = new_array;
    alloc_array = 1;

    ld(0);
  }
}